

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

void __thiscall re2::Compiler::AddRuneRangeUTF8(Compiler *this,Rune lo,Rune hi,bool foldcase)

{
  byte bVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  bool bVar10;
  byte local_44 [4];
  byte local_40 [4];
  uint local_3c;
  Rune local_38;
  uint local_34;
  
  local_3c = hi ^ 0x10ffff;
  local_34 = lo;
LAB_0011ce2d:
  do {
    if (hi < (int)local_34) {
      return;
    }
    if ((local_34 == 0x80 && local_3c == 0) && (this->reversed_ == false)) {
      Add_80_10ffff(this);
      return;
    }
    iVar2 = 5;
    do {
      if (iVar2 == 0x14) {
        if (hi < 0x80) {
          iVar2 = UncachedRuneByteSuffix(this,(uint8)local_34,(uint8)hi,foldcase,0);
          AddSuffix(this,iVar2);
          return;
        }
        iVar2 = 6;
        goto LAB_0011cea2;
      }
      uVar8 = ~(-2 << ((byte)iVar2 & 0x1f));
      if (iVar2 == 5) {
        uVar8 = 0x7f;
      }
      iVar2 = iVar2 + 5;
    } while (hi <= (int)uVar8 || (int)uVar8 < (int)local_34);
LAB_0011ce77:
    AddRuneRangeUTF8(this,local_34,uVar8,foldcase);
    local_34 = uVar8 + 1;
  } while( true );
LAB_0011cea2:
  if (iVar2 == 0x18) {
    local_38 = hi;
    uVar8 = runetochar((char *)local_40,(Rune *)&local_34);
    uVar6 = runetochar((char *)local_44,&local_38);
    if (uVar8 != uVar6) {
      __assert_fail("(n) == (m)",
                    "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/compile.cc"
                    ,0x2f2,"void re2::Compiler::AddRuneRangeUTF8(Rune, Rune, bool)");
    }
    uVar9 = (ulong)(uVar8 - 1);
    if (this->reversed_ != true) {
      iVar4 = 0;
      iVar2 = 0;
      goto LAB_0011cfa5;
    }
    uVar5 = 0;
    uVar7 = (ulong)uVar8;
    if ((int)uVar8 < 1) {
      uVar7 = uVar5;
    }
    iVar2 = 0;
    goto LAB_0011cf3e;
  }
  uVar8 = -1 << ((byte)iVar2 & 0x1f);
  uVar6 = uVar8 & hi;
  if ((local_34 & uVar8) != uVar6) {
    if ((local_34 & ~uVar8) != 0) {
      uVar8 = ~uVar8 | local_34;
      goto LAB_0011ce77;
    }
    if ((uVar8 | hi) != 0xffffffff) goto LAB_0011ced6;
  }
  iVar2 = iVar2 + 6;
  goto LAB_0011cea2;
LAB_0011cf3e:
  if (uVar7 == uVar5) goto LAB_0011d002;
  bVar3 = local_40[0];
  bVar1 = local_44[0];
  if (uVar5 == 0) {
LAB_0011cf89:
    iVar2 = CachedRuneByteSuffix(this,bVar3,bVar1,false,iVar2);
  }
  else {
    bVar3 = local_40[uVar5];
    bVar1 = bVar3;
    if (uVar9 != uVar5 && bVar3 == local_44[uVar5]) goto LAB_0011cf89;
    iVar2 = UncachedRuneByteSuffix(this,bVar3,local_44[uVar5],false,iVar2);
  }
  uVar5 = uVar5 + 1;
  goto LAB_0011cf3e;
LAB_0011ced6:
  AddRuneRangeUTF8(this,local_34,uVar6 - 1,foldcase);
  local_34 = uVar6;
  goto LAB_0011ce2d;
LAB_0011cfa5:
  uVar6 = (uVar8 - 1) + iVar4;
  if (-1 < (int)uVar6) {
    bVar10 = iVar4 == 0;
    iVar4 = iVar4 + -1;
    if (bVar10) {
      bVar3 = local_40[uVar9];
      bVar1 = local_44[uVar9];
LAB_0011cfd8:
      iVar2 = CachedRuneByteSuffix(this,bVar3,bVar1,false,iVar2);
    }
    else {
      bVar3 = local_40[uVar6];
      bVar1 = local_44[uVar6];
      if (uVar6 != 0 && bVar3 < bVar1) goto LAB_0011cfd8;
      iVar2 = UncachedRuneByteSuffix(this,bVar3,bVar1,false,iVar2);
    }
    goto LAB_0011cfa5;
  }
LAB_0011d002:
  AddSuffix(this,iVar2);
  return;
}

Assistant:

void Compiler::AddRuneRangeUTF8(Rune lo, Rune hi, bool foldcase) {
  if (lo > hi)
    return;

  // Pick off 80-10FFFF as a common special case
  // that can bypass the slow rune_cache_.
  if (lo == 0x80 && hi == 0x10ffff && !reversed_) {
    Add_80_10ffff();
    return;
  }

  // Split range into same-length sized ranges.
  for (int i = 1; i < UTFmax; i++) {
    Rune max = MaxRune(i);
    if (lo <= max && max < hi) {
      AddRuneRangeUTF8(lo, max, foldcase);
      AddRuneRangeUTF8(max+1, hi, foldcase);
      return;
    }
  }

  // ASCII range is always a special case.
  if (hi < Runeself) {
    AddSuffix(UncachedRuneByteSuffix(static_cast<uint8>(lo),
                                     static_cast<uint8>(hi), foldcase, 0));
    return;
  }

  // Split range into sections that agree on leading bytes.
  for (int i = 1; i < UTFmax; i++) {
    uint m = (1<<(6*i)) - 1;  // last i bytes of a UTF-8 sequence
    if ((lo & ~m) != (hi & ~m)) {
      if ((lo & m) != 0) {
        AddRuneRangeUTF8(lo, lo|m, foldcase);
        AddRuneRangeUTF8((lo|m)+1, hi, foldcase);
        return;
      }
      if ((hi & m) != m) {
        AddRuneRangeUTF8(lo, (hi&~m)-1, foldcase);
        AddRuneRangeUTF8(hi&~m, hi, foldcase);
        return;
      }
    }
  }

  // Finally.  Generate byte matching equivalent for lo-hi.
  uint8 ulo[UTFmax], uhi[UTFmax];
  int n = runetochar(reinterpret_cast<char*>(ulo), &lo);
  int m = runetochar(reinterpret_cast<char*>(uhi), &hi);
  (void)m;  // USED(m)
  DCHECK_EQ(n, m);

  // The logic below encodes this thinking:
  //
  // 1. When we have built the whole suffix, we know that it cannot
  // possibly be a suffix of anything longer: in forward mode, nothing
  // else can occur before the leading byte; in reverse mode, nothing
  // else can occur after the last continuation byte or else the leading
  // byte would have to change. Thus, there is no benefit to caching
  // the first byte of the suffix whereas there is a cost involved in
  // cloning it if it begins a common prefix, which is fairly likely.
  //
  // 2. Conversely, the last byte of the suffix cannot possibly be a
  // prefix of anything because next == 0, so we will never want to
  // clone it, but it is fairly likely to be a common suffix. Perhaps
  // more so in reverse mode than in forward mode because the former is
  // "converging" towards lower entropy, but caching is still worthwhile
  // for the latter in cases such as 80-BF.
  //
  // 3. Handling the bytes between the first and the last is less
  // straightforward and, again, the approach depends on whether we are
  // "converging" towards lower entropy: in forward mode, a single byte
  // is unlikely to be part of a common suffix whereas a byte range
  // is more likely so; in reverse mode, a byte range is unlikely to
  // be part of a common suffix whereas a single byte is more likely
  // so. The same benefit versus cost argument applies here.
  int id = 0;
  if (reversed_) {
    for (int i = 0; i < n; i++) {
      // In reverse UTF-8 mode: cache the leading byte; don't cache the last
      // continuation byte; cache anything else iff it's a single byte (XX-XX).
      if (i == 0 || (ulo[i] == uhi[i] && i != n-1))
        id = CachedRuneByteSuffix(ulo[i], uhi[i], false, id);
      else
        id = UncachedRuneByteSuffix(ulo[i], uhi[i], false, id);
    }
  } else {
    for (int i = n-1; i >= 0; i--) {
      // In forward UTF-8 mode: don't cache the leading byte; cache the last
      // continuation byte; cache anything else iff it's a byte range (XX-YY).
      if (i == n-1 || (ulo[i] < uhi[i] && i != 0))
        id = CachedRuneByteSuffix(ulo[i], uhi[i], false, id);
      else
        id = UncachedRuneByteSuffix(ulo[i], uhi[i], false, id);
    }
  }
  AddSuffix(id);
}